

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkDeclaration
          (FunctionReturnTypeEvaluator *this,DeclExpr *de)

{
  TreeOp TVar1;
  Node *this_00;
  DeclExpr *in_RSI;
  long in_RDI;
  Decl *decl;
  
  this_00 = (Node *)DeclExpr::declaration(in_RSI);
  TVar1 = Node::op(this_00);
  if (TVar1 == TO_FUNCTION) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x80;
  }
  else if (TVar1 == TO_CLASS) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x800;
  }
  else if (TVar1 == TO_TABLE) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x20;
  }
  return;
}

Assistant:

void FunctionReturnTypeEvaluator::checkDeclaration(const DeclExpr *de) {
  const Decl *decl = de->declaration();

  switch (decl->op())
  {
  case TO_CLASS: flags |= RT_CLASS; break;
  case TO_FUNCTION: flags |= RT_CLOSURE; break;
  case TO_TABLE: flags |= RT_TABLE; break;
  default:
    break;
  }
}